

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void __thiscall
mxx::custom_op<long>::custom_op<MxxReduce_GlobalReduce_Test::TestBody()::__0>(custom_op<long> *this)

{
  MPI_Datatype poVar1;
  datatype dt;
  _Any_data __tmp;
  
  this->_vptr_custom_op = (_func_int **)&PTR__custom_op_00142e90;
  *(undefined8 *)&(this->m_user_func).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_user_func).super__Function_base._M_functor + 8) = 0;
  (this->m_user_func).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_user_func)._M_invoker = (_Invoker_type)0x0;
  this->m_builtin = false;
  dt.builtin = false;
  dt._17_7_ = 0;
  dt._vptr_datatype = (_func_int **)0x0;
  dt.mpitype = (MPI_Datatype)0x0;
  __tmp._M_unused._M_object = operator_new(0x10);
  poVar1 = dt.mpitype;
  *(code **)__tmp._M_unused._0_8_ = custom_function<MxxReduce_GlobalReduce_Test::TestBody()::__0>;
  __tmp._8_8_ = dt.mpitype;
  dt._vptr_datatype = (_func_int **)0x0;
  dt.mpitype = (MPI_Datatype)0x0;
  *(undefined8 *)&(this->m_user_func).super__Function_base._M_functor = __tmp._M_unused._M_object;
  *(MPI_Datatype *)((long)&(this->m_user_func).super__Function_base._M_functor + 8) = poVar1;
  dt.builtin = false;
  dt._17_7_ = 0;
  (this->m_user_func).super__Function_base._M_manager =
       std::
       _Function_handler<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**),_std::_Bind<void_(*((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:242:47),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:242:47),_void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>
       ::_M_manager;
  (this->m_user_func)._M_invoker =
       std::
       _Function_handler<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**),_std::_Bind<void_(*((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:242:47),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:242:47),_void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&dt);
  dt._vptr_datatype = (_func_int **)&PTR__datatype_00142cf8;
  dt.mpitype = (MPI_Datatype)&ompi_mpi_long;
  dt.builtin = true;
  MPI_Type_dup(&ompi_mpi_long,&this->m_type_copy);
  __tmp._0_4_ = 0x543;
  attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::set
            (&this->m_type_copy,(int *)__tmp._M_pod_data,&this->m_user_func);
  MPI_Op_create(mpi_user_function,1,&this->m_op);
  datatype::~datatype(&dt);
  return;
}

Assistant:

custom_op(Func func, const bool commutative = true) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            namespace ph = std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                   std::forward<Func>(func),
                                   ph::_1, ph::_2, ph::_3, ph::_4);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, commutative, &m_op);
        }
    }